

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
internal_validate_next_chunk
          (exr_encode_pipeline_t *encode,_internal_exr_context *pctxt,_internal_exr_part *part)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_stack_00000008;
  int lpc;
  int cidx;
  exr_result_t rv;
  int32_t *in_stack_00000040;
  int local_28;
  int local_24;
  exr_result_t local_4;
  
  local_24 = 0;
  if (*(int *)(in_RSI + 0xb8) == *(int *)(in_RDI + 0xc)) {
    local_28 = -1;
    if ((*(int *)(in_RDX + 4) == 1) || (*(int *)(in_RDX + 4) == 3)) {
      local_24 = validate_and_compute_tile_chunk_off
                           (pctxt,part,rv,cidx,lpc,in_stack_00000008,in_stack_00000040);
    }
    else {
      local_28 = *(int *)(in_RDI + 0x20) - *(int *)(in_RDX + 0x94);
      if (1 < *(short *)(in_RDX + 0xf0)) {
        local_28 = local_28 / (int)*(short *)(in_RDX + 0xf0);
      }
    }
    if (local_24 == 0) {
      if ((local_28 < 0) || (*(int *)(in_RDX + 0xf4) <= local_28)) {
        local_24 = (**(code **)(in_RSI + 0x48))
                             (in_RSI,3,
                              "Chunk index for scanline %d in chunk %d outside chunk count %d",
                              *(undefined4 *)(in_RDI + 0x20),local_28,*(undefined4 *)(in_RDX + 0xf4)
                             );
      }
      else if ((*(int *)(in_RDX + 0xb4) != 2) && (*(int *)(in_RSI + 0xbc) != local_28 + -1)) {
        local_24 = (**(code **)(in_RSI + 0x48))
                             (in_RSI,0x19,"Attempt to write chunk %d, but last output chunk is %d",
                              local_28,*(undefined4 *)(in_RSI + 0xbc));
      }
    }
    local_4 = local_24;
  }
  else {
    local_4 = (**(code **)(in_RSI + 0x38))(in_RSI,0x18);
  }
  return local_4;
}

Assistant:

exr_result_t
internal_validate_next_chunk (
    exr_encode_pipeline_t*              encode,
    const struct _internal_exr_context* pctxt,
    const struct _internal_exr_part*    part)
{
    exr_result_t rv = EXR_ERR_SUCCESS;
    int          cidx, lpc;

    if (pctxt->cur_output_part != encode->part_index)
        return pctxt->standard_error (pctxt, EXR_ERR_INCORRECT_PART);

    cidx = -1;

    if (part->storage_mode == EXR_STORAGE_TILED ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        rv = validate_and_compute_tile_chunk_off (
            pctxt,
            part,
            encode->chunk.start_x,
            encode->chunk.start_y,
            encode->chunk.level_x,
            encode->chunk.level_y,
            &cidx);
    }
    else
    {
        lpc  = part->lines_per_chunk;
        cidx = (encode->chunk.start_y - part->data_window.min.y);
        if (lpc > 1) cidx /= lpc;

        //if (part->lineorder == EXR_LINEORDER_DECREASING_Y)
        //{
        //    cidx = part->chunk_count - (cidx + 1);
        //}
    }

    if (rv == EXR_ERR_SUCCESS)
    {
        if (cidx < 0 || cidx >= part->chunk_count)
        {
            rv = pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Chunk index for scanline %d in chunk %d outside chunk count %d",
                encode->chunk.start_y,
                cidx,
                part->chunk_count);
        }
        else if (
            part->lineorder != EXR_LINEORDER_RANDOM_Y &&
            pctxt->last_output_chunk != (cidx - 1))
        {
            rv = pctxt->print_error (
                pctxt,
                EXR_ERR_INCORRECT_CHUNK,
                "Attempt to write chunk %d, but last output chunk is %d",
                cidx,
                pctxt->last_output_chunk);
        }
    }
    return rv;
}